

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  float *pfVar2;
  float *pfVar3;
  Vec3fx *pVVar4;
  BBox1f BVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  PrimRefMB *pPVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined4 uVar16;
  size_t *psVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar37;
  undefined1 auVar32 [12];
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar35;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  float fVar49;
  float fVar54;
  float fVar55;
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  float fVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  float fVar61;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float local_120;
  float local_11c;
  ulong local_108;
  unsigned_long local_e0;
  size_t local_d8;
  size_t local_d0;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  BBox1f local_a8;
  
  local_b8 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  aVar46 = _DAT_01feba00;
  local_c8._0_4_ = (undefined4)DAT_01feba00;
  local_c8._4_4_ = DAT_01feba00._4_4_;
  fStack_c0 = DAT_01feba00._8_4_;
  fStack_bc = DAT_01feba00._12_4_;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper
   .field_0.m128 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_b8;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper
   .field_0.m128 = aVar46;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_b8;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
   .m128 = aVar46;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar21 = r->_begin;
  local_120 = (__return_storage_ptr__->time_range).lower;
  local_11c = 0.0;
  local_d8 = __return_storage_ptr__->num_time_segments;
  local_108 = __return_storage_ptr__->max_num_time_segments;
  local_a8 = __return_storage_ptr__->max_time_range;
  aVar53 = local_b8;
  aVar57 = aVar46;
  aVar60 = local_b8;
  if (uVar21 < r->_end) {
    local_e0 = (__return_storage_ptr__->object_range)._end;
    _local_c8 = aVar46.m128;
    local_d0 = k;
    do {
      BVar5 = (this->super_Points).super_Geometry.time_range;
      fVar24 = BVar5.lower;
      fVar56 = (this->super_Points).super_Geometry.fnumTimeSegments;
      fVar25 = t0t1->lower;
      fVar26 = t0t1->upper;
      fVar41 = BVar5.upper - fVar24;
      fVar23 = ceilf(((fVar26 - fVar24) / fVar41) * 0.99999976 * fVar56);
      uVar13 = uVar21 & 0xffffffff;
      pBVar6 = (this->super_Points).vertices.items;
      if (uVar13 < (pBVar6->super_RawBufferView).num) {
        if (fVar56 <= fVar23) {
          fVar23 = fVar56;
        }
        uVar18 = (uint)fVar23;
        fVar24 = floorf(((fVar25 - fVar24) / fVar41) * 1.0000002 * fVar56);
        fVar23 = 0.0;
        if (0.0 <= fVar24) {
          fVar23 = fVar24;
        }
        uVar14 = (uint)fVar23;
        bVar22 = uVar18 < uVar14;
        if (uVar14 <= uVar18) {
          uVar15 = (ulong)(int)uVar14;
          pcVar7 = pBVar6[uVar15].super_RawBufferView.ptr_ofs;
          pfVar2 = (float *)(pcVar7 + pBVar6[uVar15].super_RawBufferView.stride * uVar13);
          fVar23 = pfVar2[3];
          auVar59._4_4_ = -(uint)(pfVar2[1] <= -1.844e+18);
          auVar59._0_4_ = -(uint)(*pfVar2 <= -1.844e+18);
          auVar59._8_4_ = -(uint)(pfVar2[2] <= -1.844e+18);
          auVar59._12_4_ = -(uint)(fVar23 <= -1.844e+18);
          auVar63._4_4_ = -(uint)(1.844e+18 <= pfVar2[1]);
          auVar63._0_4_ = -(uint)(1.844e+18 <= *pfVar2);
          auVar63._8_4_ = -(uint)(1.844e+18 <= pfVar2[2]);
          auVar63._12_4_ = -(uint)(1.844e+18 <= fVar23);
          if ((0.0 <= fVar23) &&
             (uVar16 = movmskps((int)pcVar7,auVar59 | auVar63), (char)uVar16 == '\0')) {
            psVar17 = &pBVar6[uVar15 + 1].super_RawBufferView.stride;
            do {
              uVar15 = uVar15 + 1;
              bVar22 = (ulong)(long)(int)uVar18 < uVar15;
              if ((ulong)(long)(int)uVar18 < uVar15) goto LAB_00aca497;
              pRVar1 = (RawBufferView *)(psVar17 + -2);
              pfVar2 = (float *)(pRVar1->ptr_ofs + *psVar17 * uVar13);
              fVar23 = pfVar2[3];
              auVar29._4_4_ = -(uint)(pfVar2[1] <= -1.844e+18);
              auVar29._0_4_ = -(uint)(*pfVar2 <= -1.844e+18);
              auVar29._8_4_ = -(uint)(pfVar2[2] <= -1.844e+18);
              auVar29._12_4_ = -(uint)(fVar23 <= -1.844e+18);
              auVar33._4_4_ = -(uint)(1.844e+18 <= pfVar2[1]);
              auVar33._0_4_ = -(uint)(1.844e+18 <= *pfVar2);
              auVar33._8_4_ = -(uint)(1.844e+18 <= pfVar2[2]);
              auVar33._12_4_ = -(uint)(1.844e+18 <= fVar23);
              if (fVar23 < 0.0) break;
              psVar17 = psVar17 + 7;
              uVar16 = movmskps((int)pRVar1->ptr_ofs,auVar29 | auVar33);
            } while ((char)uVar16 == '\0');
          }
          if (!bVar22) goto LAB_00aca957;
        }
LAB_00aca497:
        fVar23 = (this->super_Points).super_Geometry.time_range.lower;
        fVar24 = (this->super_Points).super_Geometry.time_range.upper - fVar23;
        fVar41 = (fVar25 - fVar23) / fVar24;
        fVar24 = (fVar26 - fVar23) / fVar24;
        fVar23 = fVar56 * fVar24;
        fVar25 = floorf(fVar56 * fVar41);
        fVar26 = ceilf(fVar23);
        iVar12 = (int)fVar25;
        if (fVar25 <= 0.0) {
          fVar25 = 0.0;
        }
        fVar27 = fVar26;
        if (fVar56 <= fVar26) {
          fVar27 = fVar56;
        }
        if (iVar12 < 0) {
          iVar12 = -1;
        }
        uVar18 = (int)fVar56 + 1U;
        if ((int)fVar26 < (int)((int)fVar56 + 1U)) {
          uVar18 = (int)fVar26;
        }
        lVar19 = (long)(int)fVar25;
        pBVar6 = (this->super_Points).vertices.items;
        pfVar2 = (float *)(pBVar6[lVar19].super_RawBufferView.ptr_ofs +
                          pBVar6[lVar19].super_RawBufferView.stride * uVar21);
        fVar61 = pfVar2[3];
        fVar26 = (this->super_Points).maxRadiusScale;
        fVar42 = *pfVar2 - fVar61 * fVar26;
        fVar47 = pfVar2[1] - fVar61 * fVar26;
        fVar48 = pfVar2[2] - fVar61 * fVar26;
        fVar31 = fVar61 * fVar26 + *pfVar2;
        fVar36 = fVar61 * fVar26 + pfVar2[1];
        fVar37 = fVar61 * fVar26 + pfVar2[2];
        lVar20 = (long)(int)fVar27;
        pfVar2 = (float *)(pBVar6[lVar20].super_RawBufferView.ptr_ofs +
                          pBVar6[lVar20].super_RawBufferView.stride * uVar21);
        fVar28 = pfVar2[3];
        fVar49 = *pfVar2 - fVar28 * fVar26;
        fVar54 = pfVar2[1] - fVar28 * fVar26;
        fVar55 = pfVar2[2] - fVar28 * fVar26;
        fVar38 = fVar28 * fVar26 + *pfVar2;
        fVar39 = fVar28 * fVar26 + pfVar2[1];
        fVar40 = fVar28 * fVar26 + pfVar2[2];
        fVar25 = fVar56 * fVar41 - fVar25;
        if (uVar18 - iVar12 == 1) {
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar56 = 1.0 - fVar25;
          auVar43._4_4_ = fVar47 * fVar56 + fVar25 * fVar54;
          auVar43._0_4_ = fVar42 * fVar56 + fVar25 * fVar49;
          fVar27 = fVar27 - fVar23;
          if (fVar27 <= 0.0) {
            fVar27 = 0.0;
          }
          fVar26 = 1.0 - fVar27;
          auVar50._0_4_ = fVar49 * fVar26 + fVar42 * fVar27;
          auVar50._4_4_ = fVar54 * fVar26 + fVar47 * fVar27;
          auVar50._8_4_ = fVar55 * fVar26 + fVar48 * fVar27;
          fVar23 = fVar26 * fVar38 + fVar27 * fVar31;
          fVar61 = fVar26 * fVar39 + fVar27 * fVar36;
          fVar42 = fVar26 * fVar40 + fVar27 * fVar37;
          auVar32._4_4_ = fVar56 * fVar36 + fVar25 * fVar39;
          auVar32._0_4_ = fVar56 * fVar31 + fVar25 * fVar38;
          auVar32._8_4_ = fVar56 * fVar37 + fVar25 * fVar40;
          auVar43._8_4_ = fVar48 * fVar56 + fVar25 * fVar55;
        }
        else {
          pfVar2 = (float *)(pBVar6[lVar19 + 1].super_RawBufferView.ptr_ofs +
                            pBVar6[lVar19 + 1].super_RawBufferView.stride * uVar21);
          fVar10 = pfVar2[3];
          pfVar3 = (float *)(pBVar6[lVar20 + -1].super_RawBufferView.ptr_ofs +
                            pBVar6[lVar20 + -1].super_RawBufferView.stride * uVar21);
          fVar11 = pfVar3[3];
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar64 = 1.0 - fVar25;
          auVar43._0_4_ = fVar42 * fVar64 + (*pfVar2 - fVar10 * fVar26) * fVar25;
          auVar43._4_4_ = fVar47 * fVar64 + (pfVar2[1] - fVar10 * fVar26) * fVar25;
          auVar43._8_4_ = fVar48 * fVar64 + (pfVar2[2] - fVar10 * fVar26) * fVar25;
          auVar44._12_4_ = (fVar61 - fVar61 * fVar26) * fVar64 + (fVar10 - fVar10 * fVar26) * fVar25
          ;
          auVar44._0_12_ = auVar43;
          auVar32._0_4_ = fVar31 * fVar64 + fVar25 * (fVar10 * fVar26 + *pfVar2);
          auVar32._4_4_ = fVar36 * fVar64 + fVar25 * (fVar10 * fVar26 + pfVar2[1]);
          auVar32._8_4_ = fVar37 * fVar64 + fVar25 * (fVar10 * fVar26 + pfVar2[2]);
          auVar34._12_4_ = (fVar61 * fVar26 + fVar61) * fVar64 + fVar25 * (fVar10 * fVar26 + fVar10)
          ;
          auVar34._0_12_ = auVar32;
          fVar27 = fVar27 - fVar23;
          if (fVar27 <= 0.0) {
            fVar27 = 0.0;
          }
          fVar25 = 1.0 - fVar27;
          auVar50._0_4_ = fVar49 * fVar25 + (*pfVar3 - fVar11 * fVar26) * fVar27;
          auVar50._4_4_ = fVar54 * fVar25 + (pfVar3[1] - fVar11 * fVar26) * fVar27;
          auVar50._8_4_ = fVar55 * fVar25 + (pfVar3[2] - fVar11 * fVar26) * fVar27;
          auVar51._12_4_ = (fVar28 - fVar28 * fVar26) * fVar25 + (fVar11 - fVar11 * fVar26) * fVar27
          ;
          auVar51._0_12_ = auVar50;
          fVar23 = fVar38 * fVar25 + fVar27 * (fVar11 * fVar26 + *pfVar3);
          fVar61 = fVar39 * fVar25 + fVar27 * (fVar11 * fVar26 + pfVar3[1]);
          fVar42 = fVar40 * fVar25 + fVar27 * (fVar11 * fVar26 + pfVar3[2]);
          fVar25 = (fVar28 * fVar26 + fVar28) * fVar25 + fVar27 * (fVar11 * fVar26 + fVar11);
          uVar14 = iVar12 + 1;
          if ((int)uVar14 < (int)uVar18) {
            psVar17 = &pBVar6[uVar14].super_RawBufferView.stride;
            do {
              fVar31 = ((float)(int)uVar14 / fVar56 - fVar41) / (fVar24 - fVar41);
              fVar28 = 1.0 - fVar31;
              pfVar2 = (float *)(((RawBufferView *)(psVar17 + -2))->ptr_ofs + *psVar17 * uVar21);
              fVar27 = pfVar2[3];
              auVar62._0_4_ =
                   (*pfVar2 - fVar27 * fVar26) - (auVar44._0_4_ * fVar28 + auVar51._0_4_ * fVar31);
              auVar62._4_4_ =
                   (pfVar2[1] - fVar27 * fVar26) - (auVar44._4_4_ * fVar28 + auVar51._4_4_ * fVar31)
              ;
              auVar62._8_4_ =
                   (pfVar2[2] - fVar27 * fVar26) - (auVar44._8_4_ * fVar28 + auVar51._8_4_ * fVar31)
              ;
              auVar62._12_4_ =
                   (fVar27 - fVar27 * fVar26) - (auVar44._12_4_ * fVar28 + auVar51._12_4_ * fVar31);
              auVar58._0_4_ =
                   (fVar27 * fVar26 + *pfVar2) - (fVar28 * auVar34._0_4_ + fVar31 * fVar23);
              auVar58._4_4_ =
                   (fVar27 * fVar26 + pfVar2[1]) - (fVar28 * auVar34._4_4_ + fVar31 * fVar61);
              auVar58._8_4_ =
                   (fVar27 * fVar26 + pfVar2[2]) - (fVar28 * auVar34._8_4_ + fVar31 * fVar42);
              auVar58._12_4_ =
                   (fVar27 * fVar26 + fVar27) - (fVar28 * auVar34._12_4_ + fVar31 * fVar25);
              auVar63 = minps(auVar62,ZEXT816(0));
              auVar59 = maxps(auVar58,ZEXT816(0));
              auVar43._0_4_ = auVar44._0_4_ + auVar63._0_4_;
              auVar43._4_4_ = auVar44._4_4_ + auVar63._4_4_;
              auVar43._8_4_ = auVar44._8_4_ + auVar63._8_4_;
              auVar44._12_4_ = auVar44._12_4_ + auVar63._12_4_;
              auVar44._0_12_ = auVar43;
              auVar50._0_4_ = auVar51._0_4_ + auVar63._0_4_;
              auVar50._4_4_ = auVar51._4_4_ + auVar63._4_4_;
              auVar50._8_4_ = auVar51._8_4_ + auVar63._8_4_;
              auVar51._12_4_ = auVar51._12_4_ + auVar63._12_4_;
              auVar51._0_12_ = auVar50;
              auVar32._0_4_ = auVar34._0_4_ + auVar59._0_4_;
              auVar32._4_4_ = auVar34._4_4_ + auVar59._4_4_;
              auVar32._8_4_ = auVar34._8_4_ + auVar59._8_4_;
              auVar34._12_4_ = auVar34._12_4_ + auVar59._12_4_;
              auVar34._0_12_ = auVar32;
              fVar23 = fVar23 + auVar59._0_4_;
              fVar61 = fVar61 + auVar59._4_4_;
              fVar42 = fVar42 + auVar59._8_4_;
              fVar25 = fVar25 + auVar59._12_4_;
              uVar14 = uVar14 + 1;
              psVar17 = psVar17 + 7;
            } while (uVar18 != uVar14);
          }
        }
        fVar56 = (float)((this->super_Points).super_Geometry.numTimeSteps - 1);
        uVar13 = (ulong)(uint)fVar56;
        aVar45.m128[3] = (float)geomID;
        aVar45._0_12_ = auVar43;
        aVar35.m128[3] = (float)uVar21;
        aVar35._0_12_ = auVar32;
        aVar52.m128[3] = fVar56;
        aVar52._0_12_ = auVar50;
        auVar30._0_4_ =
             auVar32._0_4_ * 0.5 + fVar23 * 0.5 + auVar43._0_4_ * 0.5 + auVar50._0_4_ * 0.5;
        auVar30._4_4_ =
             auVar32._4_4_ * 0.5 + fVar61 * 0.5 + auVar43._4_4_ * 0.5 + auVar50._4_4_ * 0.5;
        auVar30._8_4_ =
             auVar32._8_4_ * 0.5 + fVar42 * 0.5 + auVar43._8_4_ * 0.5 + auVar50._8_4_ * 0.5;
        auVar30._12_4_ = (float)uVar21 * 0.5 + fVar56 * 0.5 + (float)geomID * 0.5 + fVar56 * 0.5;
        BVar5 = (this->super_Points).super_Geometry.time_range;
        local_b8.m128 = (__m128)minps(local_b8.m128,aVar45.m128);
        local_e0 = local_e0 + 1;
        local_d8 = local_d8 + uVar13;
        bVar22 = local_108 < uVar13;
        if (local_108 <= uVar13) {
          local_108 = uVar13;
        }
        pPVar8 = prims->items;
        pPVar8[local_d0].lbounds.bounds0.lower.field_0 = aVar45;
        _local_c8 = (__m128)maxps(_local_c8,aVar35.m128);
        pPVar8[local_d0].lbounds.bounds0.upper.field_0 = aVar35;
        aVar60.m128 = (__m128)minps(aVar60.m128,aVar52.m128);
        pPVar8[local_d0].lbounds.bounds1.lower.field_0 = aVar52;
        auVar9._4_4_ = fVar61;
        auVar9._0_4_ = fVar23;
        auVar9._8_4_ = fVar42;
        auVar9._12_4_ = fVar56;
        aVar57.m128 = (__m128)maxps(aVar57.m128,auVar9);
        pVVar4 = &pPVar8[local_d0].lbounds.bounds1.upper;
        (pVVar4->field_0).m128[0] = fVar23;
        (pVVar4->field_0).m128[1] = fVar61;
        (pVVar4->field_0).m128[2] = fVar42;
        (pVVar4->field_0).m128[3] = fVar56;
        pPVar8[local_d0].time_range = BVar5;
        aVar53.m128 = (__m128)minps(aVar53.m128,auVar30);
        aVar46.m128 = (__m128)maxps(aVar46.m128,auVar30);
        fVar56 = BVar5.lower;
        if (fVar56 <= local_120) {
          local_120 = fVar56;
        }
        fVar26 = BVar5.upper;
        fVar25 = fVar26;
        if (fVar26 <= local_11c) {
          fVar25 = local_11c;
        }
        uVar18 = (int)((uint)bVar22 << 0x1f) >> 0x1f;
        uVar14 = (int)((uint)bVar22 << 0x1f) >> 0x1f;
        local_d0 = local_d0 + 1;
        local_a8.upper = (float)(~uVar14 & (uint)local_a8.upper | (uint)fVar26 & uVar14);
        local_a8.lower = (float)(~uVar18 & (uint)local_a8.lower | (uint)fVar56 & uVar18);
        local_11c = fVar25;
      }
LAB_00aca957:
      uVar21 = uVar21 + 1;
    } while (uVar21 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_e0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = local_b8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = (float)local_c8._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = (float)local_c8._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = fStack_c0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = fStack_bc;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar60;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar53;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar46;
  (__return_storage_ptr__->time_range).lower = local_120;
  (__return_storage_ptr__->time_range).upper = local_11c;
  __return_storage_ptr__->num_time_segments = local_d8;
  __return_storage_ptr__->max_num_time_segments = local_108;
  __return_storage_ptr__->max_time_range = local_a8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }